

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

int __thiscall QDockAreaLayoutInfo::remove(QDockAreaLayoutInfo *this,char *__filename)

{
  int index;
  QDockAreaLayoutInfo *this_00;
  int extraout_EAX;
  pointer pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<int> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  index = **(int **)(__filename + 8);
  if (*(ulong *)(__filename + 0x10) < 2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QList<QDockAreaLayoutItem>::removeAt(&this->item_list,(long)index);
      return extraout_EAX;
    }
  }
  else {
    pQVar1 = QList<QDockAreaLayoutItem>::data(&this->item_list);
    this_00 = pQVar1[index].subinfo;
    QList<int>::mid((QList<int> *)&QStack_48,(QList<int> *)__filename,1,-1);
    remove(this_00,(char *)&QStack_48);
    QArrayDataPointer<int>::~QArrayDataPointer(&QStack_48);
    unnest(this,index);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayoutInfo::remove(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());

    if (path.size() > 1) {
        const int index = path.first();
        QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        item.subinfo->remove(path.mid(1));
        unnest(index);
    } else {
        int index = path.first();
        item_list.removeAt(index);
    }
}